

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfwoff.c
# Opt level: O1

int compare_offsets(void *a,void *b)

{
  int iVar1;
  
  iVar1 = 1;
  if (*(ulong *)(*a + 8) <= *(ulong *)(*b + 8)) {
    iVar1 = -(uint)(*(ulong *)(*a + 8) < *(ulong *)(*b + 8));
  }
  return iVar1;
}

Assistant:

FT_COMPARE_DEF( int )
  compare_offsets( const void*  a,
                   const void*  b )
  {
    WOFF_Table  table1 = *(WOFF_Table*)a;
    WOFF_Table  table2 = *(WOFF_Table*)b;

    FT_ULong  offset1 = table1->Offset;
    FT_ULong  offset2 = table2->Offset;


    if ( offset1 > offset2 )
      return 1;
    else if ( offset1 < offset2 )
      return -1;
    else
      return 0;
  }